

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

void __thiscall just::file::impl::input_file::input_file(input_file *this,string *filename_)

{
  char *__filename;
  FILE *pFVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_18;
  string *filename__local;
  input_file *this_local;
  
  local_18 = filename_;
  filename__local = &this->_filename;
  std::__cxx11::string::string((string *)this,(string *)filename_);
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar1 = fopen(__filename,"rb");
  this->_f = (FILE *)pFVar1;
  if (this->_f == (FILE *)0x0) {
    std::operator+(&local_68,"Error opening ",local_18);
    std::operator+(&local_48,&local_68," for reading");
    throw_errno(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

explicit input_file(const std::string& filename_) :
          _filename(filename_),
          _f(std::fopen(filename_.c_str(), "rb"))
        {
          if (!_f)
          {
            throw_errno("Error opening " + filename_ + " for reading");
          }
        }